

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableDrawContextMenu(ImGuiTable *table)

{
  bool bVar1;
  char **ppcVar2;
  char *pcVar3;
  ImGuiTableColumn *pIVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  int other_column_n;
  long lVar8;
  int iVar9;
  long lVar10;
  bool enabled;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    iVar5 = (int)table->ContextPopupColumn;
    iVar9 = -1;
    if ((iVar5 < 0) || (table->ColumnsCount <= iVar5)) {
      pIVar4 = (ImGuiTableColumn *)0x0;
    }
    else {
      pIVar4 = (table->Columns).Data + iVar5;
      iVar9 = iVar5;
    }
    uVar7 = table->Flags & 1;
    cVar6 = (char)uVar7;
    if (uVar7 != 0) {
      if (pIVar4 != (ImGuiTableColumn *)0x0) {
        if ((pIVar4->Flags & 0x20) == 0) {
          bVar1 = pIVar4->IsEnabled;
        }
        else {
          bVar1 = false;
        }
        pcVar3 = "*Missing Text*";
        if (GImGui->LocalizationTable[0] != (char *)0x0) {
          pcVar3 = GImGui->LocalizationTable[0];
        }
        bVar1 = MenuItem(pcVar3,(char *)0x0,false,bVar1);
        if (bVar1) {
          pIVar4 = (table->Columns).Data;
          if (pIVar4[iVar9].IsEnabled == true) {
            pIVar4[iVar9].CannotSkipItemsQueue = '\x01';
            table->AutoFitSingleColumn = (ImGuiTableColumnIdx)iVar9;
          }
        }
      }
      if ((table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount) &&
         ((table->Flags & 0xe000U) != 0x4000)) {
        ppcVar2 = GImGui->LocalizationTable + 1;
      }
      else {
        ppcVar2 = GImGui->LocalizationTable + 2;
      }
      pcVar3 = "*Missing Text*";
      if (*ppcVar2 != (char *)0x0) {
        pcVar3 = *ppcVar2;
      }
      bVar1 = MenuItem(pcVar3,(char *)0x0,false,true);
      if (bVar1) {
        TableSetColumnWidthAutoAll(table);
      }
    }
    if ((table->Flags & 2) != 0) {
      pcVar3 = "*Missing Text*";
      if (GImGui->LocalizationTable[3] != (char *)0x0) {
        pcVar3 = GImGui->LocalizationTable[3];
      }
      bVar1 = MenuItem(pcVar3,(char *)0x0,false,(bool)(table->IsDefaultDisplayOrder ^ 1));
      cVar6 = '\x01';
      if (bVar1) {
        table->IsResetDisplayOrderRequest = true;
      }
    }
    if ((table->Flags & 4) != 0) {
      if (cVar6 != '\0') {
        Separator();
      }
      PushItemFlag(0x20,true);
      lVar10 = 0x5c;
      for (lVar8 = 0; lVar8 < table->ColumnsCount; lVar8 = lVar8 + 1) {
        pIVar4 = (table->Columns).Data;
        uVar7 = *(uint *)((long)pIVar4 + lVar10 + -0x5c);
        cVar6 = (char)uVar7;
        if ((uVar7 & 1) == 0) {
          pcVar3 = TableGetColumnName(table,(int)lVar8);
          if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
            pcVar3 = "<Unknown>";
          }
          enabled = -1 < cVar6;
          bVar1 = *(bool *)((long)pIVar4 + lVar10 + -1);
          if (bVar1 == true) {
            enabled = '\x01' < table->ColumnsEnabledCount && -1 < cVar6;
          }
          bVar1 = MenuItem(pcVar3,(char *)0x0,bVar1,enabled);
          if (bVar1) {
            *(byte *)((long)&pIVar4->Flags + lVar10) = *(byte *)((long)pIVar4 + lVar10 + -1) ^ 1;
          }
        }
        lVar10 = lVar10 + 0x68;
      }
      PopItemFlag();
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableDrawContextMenu(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    bool want_separator = false;
    const int column_n = (table->ContextPopupColumn >= 0 && table->ContextPopupColumn < table->ColumnsCount) ? table->ContextPopupColumn : -1;
    ImGuiTableColumn* column = (column_n != -1) ? &table->Columns[column_n] : NULL;

    // Sizing
    if (table->Flags & ImGuiTableFlags_Resizable)
    {
        if (column != NULL)
        {
            const bool can_resize = !(column->Flags & ImGuiTableColumnFlags_NoResize) && column->IsEnabled;
            if (MenuItem(LocalizeGetMsg(ImGuiLocKey_TableSizeOne), NULL, false, can_resize)) // "###SizeOne"
                TableSetColumnWidthAutoSingle(table, column_n);
        }

        const char* size_all_desc;
        if (table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount && (table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame)
            size_all_desc = LocalizeGetMsg(ImGuiLocKey_TableSizeAllFit);        // "###SizeAll" All fixed
        else
            size_all_desc = LocalizeGetMsg(ImGuiLocKey_TableSizeAllDefault);    // "###SizeAll" All stretch or mixed
        if (MenuItem(size_all_desc, NULL))
            TableSetColumnWidthAutoAll(table);
        want_separator = true;
    }

    // Ordering
    if (table->Flags & ImGuiTableFlags_Reorderable)
    {
        if (MenuItem(LocalizeGetMsg(ImGuiLocKey_TableResetOrder), NULL, false, !table->IsDefaultDisplayOrder))
            table->IsResetDisplayOrderRequest = true;
        want_separator = true;
    }

    // Reset all (should work but seems unnecessary/noisy to expose?)
    //if (MenuItem("Reset all"))
    //    table->IsResetAllRequest = true;

    // Sorting
    // (modify TableOpenContextMenu() to add _Sortable flag if enabling this)
#if 0
    if ((table->Flags & ImGuiTableFlags_Sortable) && column != NULL && (column->Flags & ImGuiTableColumnFlags_NoSort) == 0)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        bool append_to_sort_specs = g.IO.KeyShift;
        if (MenuItem("Sort in Ascending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Ascending, (column->Flags & ImGuiTableColumnFlags_NoSortAscending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Ascending, append_to_sort_specs);
        if (MenuItem("Sort in Descending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Descending, (column->Flags & ImGuiTableColumnFlags_NoSortDescending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Descending, append_to_sort_specs);
    }
#endif

    // Hiding / Visibility
    if (table->Flags & ImGuiTableFlags_Hideable)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        PushItemFlag(ImGuiItemFlags_SelectableDontClosePopup, true);
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
        {
            ImGuiTableColumn* other_column = &table->Columns[other_column_n];
            if (other_column->Flags & ImGuiTableColumnFlags_Disabled)
                continue;

            const char* name = TableGetColumnName(table, other_column_n);
            if (name == NULL || name[0] == 0)
                name = "<Unknown>";

            // Make sure we can't hide the last active column
            bool menu_item_active = (other_column->Flags & ImGuiTableColumnFlags_NoHide) ? false : true;
            if (other_column->IsUserEnabled && table->ColumnsEnabledCount <= 1)
                menu_item_active = false;
            if (MenuItem(name, NULL, other_column->IsUserEnabled, menu_item_active))
                other_column->IsUserEnabledNextFrame = !other_column->IsUserEnabled;
        }
        PopItemFlag();
    }
}